

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack31_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in % 0x80000000;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x1f;
  *puVar1 = (in[1] & 0x3fffffff) << 1 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[1] >> 0x1e;
  *puVar1 = (in[2] & 0x1fffffff) << 2 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[2] >> 0x1d;
  *puVar1 = (in[3] & 0xfffffff) << 3 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[3] >> 0x1c;
  *puVar1 = (in[4] & 0x7ffffff) << 4 | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[4] >> 0x1b;
  *puVar1 = (in[5] & 0x3ffffff) << 5 | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[5] >> 0x1a;
  *puVar1 = (in[6] & 0x1ffffff) << 6 | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[6] >> 0x19;
  *puVar1 = (in[7] & 0xffffff) << 7 | *puVar1;
  return in + 8;
}

Assistant:

const uint32_t *__fastunpack31_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 31);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 30)) << (31 - 30);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 29)) << (31 - 29);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 28)) << (31 - 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 27)) << (31 - 27);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 26)) << (31 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 25)) << (31 - 25);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 24)) << (31 - 24);
  out++;

  return in + 1;
}